

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O2

Ver_Bundle_t * Ver_ParseGetNondrivenBundle(Abc_Ntk_t *pNtk,int Counter)

{
  int iVar1;
  void *pvVar2;
  Ver_Bundle_t *pVVar3;
  int i;
  int iVar4;
  
  i = 0;
  do {
    if (((Vec_Ptr_t *)pNtk->pData)->nSize <= i) {
      return (Ver_Bundle_t *)0x0;
    }
    pvVar2 = Vec_PtrEntry((Vec_Ptr_t *)pNtk->pData,i);
    iVar4 = (*(Vec_Ptr_t **)((long)pvVar2 + 0x40))->nSize;
    if ((Counter < iVar4) &&
       (pVVar3 = (Ver_Bundle_t *)Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar2 + 0x40),iVar4 + ~Counter)
       , pVVar3 != (Ver_Bundle_t *)0x0)) {
      for (iVar4 = 0; iVar4 < pVVar3->vNetsActual->nSize; iVar4 = iVar4 + 1) {
        pvVar2 = Vec_PtrEntry(pVVar3->vNetsActual,iVar4);
        if ((*(int *)((long)pvVar2 + 0x1c) == 0) &&
           (iVar1 = Ver_ParseFormalNetsAreDriven(pNtk,pVVar3->pNameFormal), iVar1 == 0)) {
          return pVVar3;
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

Ver_Bundle_t * Ver_ParseGetNondrivenBundle( Abc_Ntk_t * pNtk, int Counter )
{
    Ver_Bundle_t * pBundle;
    Abc_Obj_t * pBox, * pNet;
    int k, m;
    // go through instances of this type
    Vec_PtrForEachEntry( Abc_Obj_t *, (Vec_Ptr_t *)pNtk->pData, pBox, k )
    {
        if ( Counter >= Vec_PtrSize((Vec_Ptr_t *)pBox->pCopy) )
            continue;
        // get the bundle given distance away
        pBundle = (Ver_Bundle_t *)Vec_PtrEntry( (Vec_Ptr_t *)pBox->pCopy, Vec_PtrSize((Vec_Ptr_t *)pBox->pCopy) - 1 - Counter );
        if ( pBundle == NULL )
            continue;
        // go through the actual nets of this bundle
        Vec_PtrForEachEntry( Abc_Obj_t *, pBundle->vNetsActual, pNet, m )
            if ( !Abc_ObjFaninNum(pNet) && !Ver_ParseFormalNetsAreDriven(pNtk, pBundle->pNameFormal) ) // non-driven
                return pBundle;
    }
    return NULL;
}